

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O3

SampledSpectrum __thiscall
pbrt::SpectrumImageTexture::Evaluate
          (SpectrumImageTexture *this,TextureEvalContext ctx,SampledWavelengths lambda)

{
  Float FVar1;
  RGBColorSpace *cs;
  float fVar2;
  anon_class_24_3_48d30edf func;
  undefined8 uVar8;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar12 [56];
  undefined1 auVar11 [64];
  float fVar13;
  RGB RVar14;
  SampledSpectrum SVar15;
  RGBSpectrum *local_b8;
  Tuple2<pbrt::Point2,_float> *pTStack_b0;
  Tuple2<pbrt::Vector2,_float> **local_a8;
  Tuple2<pbrt::Point2,_float> local_a0;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  Tuple2<pbrt::Vector2,_float> local_80;
  Tuple2<pbrt::Vector2,_float> local_78;
  Tuple2<pbrt::Vector2,_float> *local_70;
  RGBSpectrum local_68;
  float fStack_40;
  Float FStack_3c;
  Float FStack_38;
  Float FStack_34;
  Float FStack_30;
  int iStack_2c;
  undefined1 extraout_var [56];
  undefined1 auVar9 [56];
  undefined1 auVar10 [64];
  
  if ((this->super_ImageTextureBase).mipmap == (MIPMap *)0x0) {
    FVar1 = (this->super_ImageTextureBase).scale;
    auVar4._4_4_ = FVar1;
    auVar4._0_4_ = FVar1;
    auVar4._8_4_ = FVar1;
    auVar4._12_4_ = FVar1;
  }
  else {
    local_a0 = (Tuple2<pbrt::Point2,_float>)&local_78;
    local_70 = &local_80;
    pTStack_b0 = &local_a0;
    local_b8 = &local_68;
    local_78.x = 0.0;
    local_78.y = 0.0;
    local_80.x = 0.0;
    local_80.y = 0.0;
    local_a8 = &local_70;
    local_68.rgb.r = ctx.p.super_Tuple3<pbrt::Point3,_float>.x;
    local_68.rgb.g = ctx.p.super_Tuple3<pbrt::Point3,_float>.y;
    local_68.rgb.b = ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
    local_68.scale = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
    local_68.rsp.c0 = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
    local_68.rsp.c1 = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
    local_68.rsp.c2 = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
    local_68._28_4_ = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
    local_68.illuminant = (DenselySampledSpectrum *)ctx._32_8_;
    fStack_40 = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
    FStack_3c = ctx.dudx;
    FStack_38 = ctx.dudy;
    FStack_34 = ctx.dvdx;
    FStack_30 = ctx.dvdy;
    iStack_2c = ctx.faceIndex;
    func.dstdx = (Vector2f **)pTStack_b0;
    func.ctx = (TextureEvalContext *)local_b8;
    func.dstdy = (Vector2f **)local_a8;
    auVar5._0_8_ = TaggedPointer<pbrt::UVMapping2D,pbrt::SphericalMapping2D,pbrt::CylindricalMapping2D,pbrt::PlanarMapping2D>
                   ::
                   Dispatch<pbrt::TextureMapping2DHandle::Map(pbrt::TextureEvalContext,pbrt::Vector2<float>*,pbrt::Vector2<float>*)const::_lambda(auto:1)_1_>
                             ((TaggedPointer<pbrt::UVMapping2D,pbrt::SphericalMapping2D,pbrt::CylindricalMapping2D,pbrt::PlanarMapping2D>
                               *)this,func);
    auVar5._8_56_ = extraout_var;
    uVar8 = vmovlps_avx(auVar5._0_16_);
    auVar4 = vmovshdup_avx(auVar5._0_16_);
    local_a0.x = (float)uVar8;
    local_a0.y = 1.0 - auVar4._0_4_;
    uVar8 = 0;
    local_98 = (this->super_ImageTextureBase).scale;
    fStack_94 = local_98;
    fStack_90 = local_98;
    fStack_8c = local_98;
    RVar14 = MIPMap::Lookup<pbrt::RGB>
                       ((this->super_ImageTextureBase).mipmap,(Point2f *)&local_a0,
                        (Vector2f)local_78,(Vector2f)local_80);
    auVar3._0_4_ = local_98 * RVar14.r;
    auVar3._4_4_ = fStack_94 * RVar14.g;
    auVar3._8_4_ = fStack_90 * (float)uVar8;
    auVar3._12_4_ = fStack_8c * (float)((ulong)uVar8 >> 0x20);
    fVar2 = local_98 * RVar14.b;
    auVar12 = (undefined1  [56])0x0;
    local_b8 = (RGBSpectrum *)vmovlps_avx(auVar3);
    pTStack_b0 = (Tuple2<pbrt::Point2,_float> *)CONCAT44(pTStack_b0._4_4_,fVar2);
    cs = ((this->super_ImageTextureBase).mipmap)->colorSpace;
    if (cs == (RGBColorSpace *)0x0) {
      auVar4 = vmovshdup_avx(auVar3);
      fVar13 = auVar4._0_4_;
      if (((auVar3._0_4_ != fVar13) || (fVar13 != fVar2)) || (NAN(fVar13) || NAN(fVar2))) {
        LogFatal<char_const(&)[37]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/textures.cpp"
                   ,0x1ba,"Check failed: %s",(char (*) [37])"rgb[0] == rgb[1] && rgb[1] == rgb[2]");
      }
      auVar4._4_4_ = auVar3._0_4_;
      auVar4._0_4_ = auVar3._0_4_;
      auVar4._8_4_ = auVar3._0_4_;
      auVar4._12_4_ = auVar3._0_4_;
    }
    else {
      auVar4 = vmovshdup_avx(auVar3);
      auVar4 = vmaxss_avx(auVar4,auVar3);
      auVar4 = vmaxss_avx(ZEXT416((uint)fVar2),auVar4);
      auVar9 = ZEXT856(auVar4._8_8_);
      if (auVar4._0_4_ <= 1.0) {
        RGBReflectanceSpectrum::RGBReflectanceSpectrum
                  ((RGBReflectanceSpectrum *)&local_68,cs,(RGB *)&local_b8);
        SVar15 = RGBReflectanceSpectrum::Sample((RGBReflectanceSpectrum *)&local_68,&lambda);
        auVar11._0_8_ = SVar15.values.values._8_8_;
        auVar11._8_56_ = auVar12;
        auVar3 = auVar11._0_16_;
        auVar7._0_8_ = SVar15.values.values._0_8_;
        auVar7._8_56_ = auVar9;
        auVar4 = auVar7._0_16_;
      }
      else {
        RGBSpectrum::RGBSpectrum(&local_68,cs,(RGB *)&local_b8);
        SVar15 = RGBSpectrum::Sample(&local_68,&lambda);
        auVar10._0_8_ = SVar15.values.values._8_8_;
        auVar10._8_56_ = auVar12;
        auVar3 = auVar10._0_16_;
        auVar6._0_8_ = SVar15.values.values._0_8_;
        auVar6._8_56_ = auVar9;
        auVar4 = auVar6._0_16_;
      }
      auVar4 = vmovlhps_avx(auVar4,auVar3);
    }
  }
  auVar3 = vshufpd_avx(auVar4,auVar4,1);
  SVar15.values.values._0_8_ = auVar4._0_8_;
  SVar15.values.values._8_8_ = auVar3._0_8_;
  return (SampledSpectrum)SVar15.values.values;
}

Assistant:

SampledSpectrum SpectrumImageTexture::Evaluate(TextureEvalContext ctx,
                                               SampledWavelengths lambda) const {
#ifdef PBRT_IS_GPU_CODE
    assert(!"Should not be called in GPU code");
    return SampledSpectrum(0);
#else
    if (!mipmap)
        return SampledSpectrum(scale);
    Vector2f dstdx, dstdy;
    Point2f st = mapping.Map(ctx, &dstdx, &dstdy);
    // Texture coordinates are (0,0) in the lower left corner, but
    // image coordinates are (0,0) in the upper left.
    st[1] = 1 - st[1];
    RGB rgb = scale * mipmap->Lookup<RGB>(st, dstdx, dstdy);
    const RGBColorSpace *cs = mipmap->GetRGBColorSpace();
    if (cs != nullptr) {
        if (std::max({rgb.r, rgb.g, rgb.b}) > 1)
            return RGBSpectrum(*cs, rgb).Sample(lambda);
        return RGBReflectanceSpectrum(*cs, rgb).Sample(lambda);
    }
    // otherwise it better be a one-channel texture
    CHECK(rgb[0] == rgb[1] && rgb[1] == rgb[2]);
    return SampledSpectrum(rgb[0]);
#endif
}